

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

SceneObject * __thiscall
CMU462::Application::init_sphere(Application *this,SphereInfo *sphere,Matrix4x4 *transform)

{
  SceneObject *pSVar1;
  Sphere *in_RDX;
  double scale;
  Vector3D *position;
  Vector4D *in_stack_fffffffffffffeb8;
  Vector4D *this_00;
  undefined1 *scale_00;
  Vector3D *position_00;
  SphereInfo *info;
  Vector4D local_d8 [2];
  double local_80;
  Vector4D local_78;
  Vector4D *in_stack_ffffffffffffffb0;
  Matrix4x4 *in_stack_ffffffffffffffb8;
  undefined1 local_38 [24];
  undefined1 *local_20;
  Sphere *local_18;
  
  this_00 = &local_78;
  info = (SphereInfo *)0x0;
  position_00 = (Vector3D *)0x3ff0000000000000;
  local_18 = in_RDX;
  Vector4D::Vector4D(this_00,0.0,0.0,0.0,1.0);
  Matrix4x4::operator*(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  scale_00 = local_38;
  Vector4D::projectTo3D(this_00);
  local_20 = scale_00;
  Vector4D::Vector4D(local_d8,(double)position_00,(double)info,(double)info,(double)info);
  Matrix4x4::operator*(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Vector4D::to3D(in_stack_fffffffffffffeb8);
  local_80 = Vector3D::norm((Vector3D *)0x268c16);
  pSVar1 = (SceneObject *)operator_new(0x120);
  DynamicScene::Sphere::Sphere(local_18,info,position_00,(double)scale_00);
  return pSVar1;
}

Assistant:

DynamicScene::SceneObject *Application::init_sphere(
    SphereInfo &sphere, const Matrix4x4 &transform) {
  const Vector3D &position = (transform * Vector4D(0, 0, 0, 1)).projectTo3D();
  double scale = (transform * Vector4D(1, 0, 0, 0)).to3D().norm();
  return new DynamicScene::Sphere(sphere, position, scale);
}